

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O2

void PushId(void)

{
  boolean bVar1;
  
  bVar1 = isvalidtype(oldtabindex);
  if (bVar1 != NO) {
    actionpush(oldtabindex);
    return;
  }
  printlexeme(oldtabindex);
  error(" is an invalid type",linenum);
}

Assistant:

void	PushId(void)
{
    if (!isvalidtype(oldtabindex))	{
        printlexeme(oldtabindex);
        error(" is an invalid type", linenum);
    }
    actionpush(oldtabindex);
}